

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_unpacklo_s16_s32(c_v256 a)

{
  c_v256 *in_RDI;
  
  in_RDI->u64[2] = CONCAT44(a.s32[2] >> 0x10,(int)a.s16[4]);
  in_RDI->u64[3] = CONCAT44(a.s32[3] >> 0x10,a.s64[1]._2_4_ >> 0x10);
  in_RDI->u64[0] = CONCAT44(a.s32[0] >> 0x10,(int)a.s16[0]);
  in_RDI->u64[1] = CONCAT44(a.s32[1] >> 0x10,a.s64[0]._2_4_ >> 0x10);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpacklo_s16_s32(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_s16_s32(a.v128[0]),
                          c_v128_unpacklo_s16_s32(a.v128[0]));
}